

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::to_unpacked_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t id,
          bool register_expression_read)

{
  Variant *pVVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  ulong uVar5;
  SPIRExpression *pSVar6;
  SPIRType *pSVar7;
  byte bVar8;
  string local_50;
  
  uVar5 = (ulong)id;
  bVar8 = 1;
  if ((uVar5 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar1 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
     pVVar1[uVar5].type == TypeExpression)) {
    pSVar6 = Variant::get<spirv_cross::SPIRExpression>(pVVar1 + uVar5);
    bVar8 = pSVar6->need_transpose ^ 1;
  }
  bVar2 = Compiler::has_extended_decoration
                    (&this->super_Compiler,id,SPIRVCrossDecorationPhysicalTypeID);
  bVar3 = Compiler::has_extended_decoration
                    (&this->super_Compiler,id,SPIRVCrossDecorationPhysicalTypePacked);
  if ((bVar8 == 0) || (!bVar2 && !bVar3)) {
    to_expression_abi_cxx11_(__return_storage_ptr__,this,id,register_expression_read);
  }
  else {
    to_expression_abi_cxx11_(&local_50,this,id,register_expression_read);
    uVar4 = Compiler::expression_type_id(&this->super_Compiler,id);
    pSVar7 = Compiler::get_pointee_type(&this->super_Compiler,uVar4);
    uVar4 = Compiler::get_extended_decoration
                      (&this->super_Compiler,id,SPIRVCrossDecorationPhysicalTypeID);
    bVar2 = Compiler::has_extended_decoration
                      (&this->super_Compiler,id,SPIRVCrossDecorationPhysicalTypePacked);
    (*(this->super_Compiler)._vptr_Compiler[0x21])
              (__return_storage_ptr__,this,&local_50,pSVar7,(ulong)uVar4,(ulong)bVar2,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_unpacked_expression(uint32_t id, bool register_expression_read)
{
	// If we need to transpose, it will also take care of unpacking rules.
	auto *e = maybe_get<SPIRExpression>(id);
	bool need_transpose = e && e->need_transpose;
	bool is_remapped = has_extended_decoration(id, SPIRVCrossDecorationPhysicalTypeID);
	bool is_packed = has_extended_decoration(id, SPIRVCrossDecorationPhysicalTypePacked);

	if (!need_transpose && (is_remapped || is_packed))
	{
		return unpack_expression_type(to_expression(id, register_expression_read),
		                              get_pointee_type(expression_type_id(id)),
		                              get_extended_decoration(id, SPIRVCrossDecorationPhysicalTypeID),
		                              has_extended_decoration(id, SPIRVCrossDecorationPhysicalTypePacked), false);
	}
	else
		return to_expression(id, register_expression_read);
}